

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjTable.hh
# Opt level: O0

NewObject * __thiscall
ObjTable<QPDFWriter::NewObject>::large_element(ObjTable<QPDFWriter::NewObject> *this,size_t idx)

{
  int iVar1;
  mapped_type *pmVar2;
  runtime_error *this_00;
  size_t local_18;
  size_t idx_local;
  ObjTable<QPDFWriter::NewObject> *this_local;
  
  local_18 = idx;
  idx_local = (size_t)this;
  if (large_element(unsigned_long)::max_size == '\0') {
    iVar1 = __cxa_guard_acquire(&large_element(unsigned_long)::max_size);
    if (iVar1 != 0) {
      large_element::max_size =
           std::vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>::max_size
                     (&this->
                       super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>);
      __cxa_guard_release(&large_element(unsigned_long)::max_size);
    }
  }
  if (local_18 < this->min_sparse) {
    this->min_sparse = local_18;
  }
  if (local_18 < large_element::max_size) {
    pmVar2 = std::
             map<unsigned_long,_QPDFWriter::NewObject,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_QPDFWriter::NewObject>_>_>
             ::operator[](&this->sparse_elements,&local_18);
    return pmVar2;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Impossibly large object id encountered accessing ObjTable");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T&
    large_element(size_t idx)
    {
        static const size_t max_size = std::vector<T>::max_size();
        if (idx < min_sparse) {
            min_sparse = idx;
        }
        if (idx < max_size) {
            return sparse_elements[idx];
        }
        throw std::runtime_error("Impossibly large object id encountered accessing ObjTable");
        return element(0); // doesn't return
    }